

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.h
# Opt level: O3

void __thiscall
cppcms::impl::
io_handler_binder_p0<void_(cppcms::impl::cgi::connection::cgi_forwarder::*)(const_std::error_code_&,_unsigned_long),_std::shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder>_>
::io_handler_binder_p0
          (io_handler_binder_p0<void_(cppcms::impl::cgi::connection::cgi_forwarder::*)(const_std::error_code_&,_unsigned_long),_std::shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder>_>
           *this,offset_in_cgi_forwarder_to_subr *f,
          shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder> *s)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  offset_in_cgi_forwarder_to_subr oVar2;
  
  (this->super_callable_type).super_refcounted._vptr_refcounted =
       (_func_int **)&PTR__refcounted_00284bd0;
  booster::atomic_counter::atomic_counter(&(this->super_callable_type).super_refcounted.refs_,0);
  (this->super_callable_type).super_refcounted._vptr_refcounted =
       (_func_int **)&PTR__io_handler_binder_p0_00284ea0;
  oVar2 = f[1];
  this->f_ = *f;
  *(offset_in_cgi_forwarder_to_subr *)&this->field_0x18 = oVar2;
  (this->s_).
  super___shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (s->
           super___shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  p_Var1 = (s->
           super___shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
  (this->s_).
  super___shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  return;
}

Assistant:

io_handler_binder_p0(F const &f,S const &s) : f_(f), s_(s) {}